

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O1

int wave_add_serial(uint user_gpio,uint baud,uint32_t databits,uint32_t stophalfbits,uint32_t offset
                   ,uint numChar,char *str)

{
  int iVar1;
  uint8_t buf [12];
  gpioExtent_t ext [2];
  
  if (numChar != 0) {
    ext[0].ptr = buf;
    ext[0].size = 0xc;
    ext[1].size = (size_t)numChar;
    ext[1].ptr = str;
    buf._0_4_ = databits;
    buf._4_4_ = stophalfbits;
    buf._8_4_ = offset;
    iVar1 = pigpio_command_ext(gPigCommand,0x1d,user_gpio,baud,numChar + 0xc,2,ext,1);
    return iVar1;
  }
  return 0;
}

Assistant:

int wave_add_serial(
   unsigned user_gpio, unsigned baud, uint32_t databits,
   uint32_t stophalfbits, uint32_t offset,  unsigned numChar, char *str)
{
   uint8_t buf[12];
   gpioExtent_t ext[2];

   /*
   p1=user_gpio
   p2=baud
   p3=len+12
   ## extension ##
   uint32_t databits
   uint32_t stophalfbits
   uint32_t offset
   char[len] str
   */

   if (!numChar) return 0;

   memcpy(buf, &databits, 4);
   memcpy(buf+4, &stophalfbits, 4);
   memcpy(buf+8, &offset, 4);

   ext[0].size = sizeof(buf);
   ext[0].ptr = buf;

   ext[1].size = numChar;
   ext[1].ptr = str;

   return pigpio_command_ext(gPigCommand, PI_CMD_WVAS,
      user_gpio, baud, numChar+sizeof(buf), 2, ext, 1);
}